

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O3

UChar32 uiter_current32_63(UCharIterator *iter)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int32_t iVar4;
  
  uVar2 = (*(code *)iter->current)();
  if ((uVar2 & 0xfffff800) == 0xd800) {
    if ((uVar2 >> 10 & 1) == 0) {
      (*iter->move)(iter,1,UITER_CURRENT);
      uVar3 = (*(code *)iter->current)(iter);
      uVar1 = uVar2 * 0x400 + uVar3 + 0xfca02400;
      if ((uVar3 & 0xfffffc00) != 0xdc00) {
        uVar1 = uVar2;
      }
      iVar4 = -1;
      uVar2 = uVar1;
    }
    else {
      uVar3 = (*(code *)iter->previous)(iter);
      uVar1 = uVar2 + 0xfca02400 + uVar3 * 0x400;
      if ((uVar3 & 0xfffffc00) != 0xd800) {
        uVar1 = uVar2;
      }
      if ((int)uVar3 < 0) {
        return uVar1;
      }
      iVar4 = 1;
      uVar2 = uVar1;
    }
    (*iter->move)(iter,iVar4,UITER_CURRENT);
  }
  return uVar2;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
uiter_current32(UCharIterator *iter) {
    UChar32 c, c2;

    c=iter->current(iter);
    if(U16_IS_SURROGATE(c)) {
        if(U16_IS_SURROGATE_LEAD(c)) {
            /*
             * go to the next code unit
             * we know that we are not at the limit because c!=U_SENTINEL
             */
            iter->move(iter, 1, UITER_CURRENT);
            if(U16_IS_TRAIL(c2=iter->current(iter))) {
                c=U16_GET_SUPPLEMENTARY(c, c2);
            }

            /* undo index movement */
            iter->move(iter, -1, UITER_CURRENT);
        } else {
            if(U16_IS_LEAD(c2=iter->previous(iter))) {
                c=U16_GET_SUPPLEMENTARY(c2, c);
            }
            if(c2>=0) {
                /* undo index movement */
                iter->move(iter, 1, UITER_CURRENT);
            }
        }
    }
    return c;
}